

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

void Gia_ManDumpTestsSimulate(Gia_Man_t *p,Vec_Int_t *vValues)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  
  if (vValues->nSize != p->vCis->nSize) {
    __assert_fail("Vec_IntSize(vValues) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcFault.c"
                  ,0x2ea,"void Gia_ManDumpTestsSimulate(Gia_Man_t *, Vec_Int_t *)");
  }
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  for (iVar5 = 0; iVar5 < p->vCis->nSize; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCi(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar2 = Vec_IntEntry(vValues,iVar5);
    *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xffffffffbfffffff | (ulong)((uVar2 & 1) << 0x1e);
  }
  for (iVar5 = 0; iVar5 < p->nObjs; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManObj(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar1 = *(ulong *)pGVar4;
    if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) {
      uVar2 = (uint)(uVar1 >> 0x20);
      *(ulong *)pGVar4 =
           uVar1 & 0xffffffff3fffffff |
           (ulong)(((uVar2 >> 0x1d ^ *(uint *)(pGVar4 + -(ulong)(uVar2 & 0x1fffffff)) >> 0x1e) &
                    ((uint)(uVar1 >> 0x1d) & 7 ^ *(uint *)(pGVar4 + -(uVar1 & 0x1fffffff)) >> 0x1e)
                   & 1) << 0x1e);
    }
  }
  for (iVar5 = 0; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCo(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar2 = (uint)*(ulong *)pGVar4;
    *(ulong *)pGVar4 =
         *(ulong *)pGVar4 & 0xffffffffbfffffff |
         (ulong)((uVar2 * 2 ^ *(uint *)(pGVar4 + -(ulong)(uVar2 & 0x1fffffff))) & 0x40000000);
  }
  vValues->nSize = 0;
  iVar5 = 0;
  do {
    iVar3 = p->nRegs;
    if (iVar3 <= iVar5) {
LAB_0044bbee:
      if (vValues->nSize == iVar3) {
        return;
      }
      __assert_fail("Vec_IntSize(vValues) == Gia_ManRegNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcFault.c"
                    ,0x2f7,"void Gia_ManDumpTestsSimulate(Gia_Man_t *, Vec_Int_t *)");
    }
    pGVar4 = Gia_ManCo(p,(p->vCos->nSize - iVar3) + iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) {
      iVar3 = p->nRegs;
      goto LAB_0044bbee;
    }
    Vec_IntPush(vValues,*(uint *)pGVar4 >> 0x1e & 1);
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void Gia_ManDumpTestsSimulate( Gia_Man_t * p, Vec_Int_t * vValues )
{
    Gia_Obj_t * pObj; int k;
    assert( Vec_IntSize(vValues) == Gia_ManCiNum(p) );
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManForEachCi( p, pObj, k )
        pObj->fMark0 = Vec_IntEntry( vValues, k );
    Gia_ManForEachAnd( p, pObj, k )
        pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                       (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
    Gia_ManForEachCo( p, pObj, k )
        pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    // collect flop input values
    Vec_IntClear( vValues );
    Gia_ManForEachRi( p, pObj, k )
        Vec_IntPush( vValues, pObj->fMark0 );
    assert( Vec_IntSize(vValues) == Gia_ManRegNum(p) );
}